

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_reader.c
# Opt level: O2

void config_close(config_t t_config)

{
  undefined8 *puVar1;
  ulong uVar2;
  
  puVar1 = (undefined8 *)((long)t_config + 0x20);
  for (uVar2 = 0; uVar2 < *(ulong *)((long)t_config + 0x8018); uVar2 = uVar2 + 1) {
    free((void *)*puVar1);
    puVar1 = puVar1 + 4;
  }
  free(*t_config);
  free(*(void **)((long)t_config + 8));
  free(t_config);
  return;
}

Assistant:

void config_close(config_t t_config)
{
	config_desc * config = (config_desc *) t_config;

	size_t i;
	for (i = 0; i < config->dicts_count; i ++)
		free(config->dicts[i].file_name);

	free(config->title);
	free(config->description);
	free(config);
}